

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdnslookup_unix.cpp
# Opt level: O1

void __thiscall QDnsLookupRunnable::query(QDnsLookupRunnable *this,QDnsLookupReply *reply)

{
  QList<QByteArray> *this_00;
  long lVar1;
  uchar *puVar2;
  byte bVar3;
  uchar uVar4;
  ushort uVar5;
  undefined2 uVar6;
  uint uVar7;
  long lVar8;
  ReplyBuffer *pRVar9;
  QDnsCachedName *pQVar10;
  QString *pQVar11;
  ulong uVar12;
  QSharedDataPointer<QDnsTextRecordPrivate> QVar13;
  QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate> QVar14;
  char16_t *pcVar15;
  QDnsTextRecord QVar16;
  QDnsTlsAssociationRecord QVar17;
  QDnsLookupReply *pQVar18;
  void *pvVar19;
  bool bVar20;
  ushort uVar21;
  int iVar22;
  uint uVar23;
  NetworkLayerProtocol NVar24;
  quint32 qVar25;
  long lVar26;
  ushort uVar27;
  int iVar28;
  char *pcVar29;
  int iVar30;
  undefined4 *puVar31;
  ushort uVar32;
  qsizetype qVar33;
  long lVar34;
  long lVar35;
  QHostAddress *this_01;
  long lVar36;
  QList<QDnsDomainNameRecord> *this_02;
  long in_FS_OFFSET;
  QSpan<unsigned_char,_18446744073709551615UL> query;
  QDnsTextRecord record_1;
  QDnsTlsAssociationRecord record;
  char16_t *pcStack_910;
  qsizetype local_908;
  QString local_8f8;
  QString local_8e0;
  anon_class_56_5_c3b57c2e local_8c8;
  int status;
  int responseLength;
  QDnsLookupReply *reply_local;
  uchar *response;
  ReplyBuffer buffer;
  QueryBuffer qbuffer;
  remove_pointer_t<res_state> state;
  
  lVar8 = *(long *)(in_FS_OFFSET + 0x28);
  reply_local = reply;
  memcpy(&state,&DAT_002808c8,0x238);
  iVar22 = __res_ninit(&state);
  if (iVar22 < 0) {
    QDnsLookupRunnable::query((QDnsLookupRunnable *)&reply_local);
    goto LAB_00236d2a;
  }
  memset((QArrayData *)&qbuffer,0xaa,0x120);
  pcVar29 = (this->requestName).d.ptr;
  if (pcVar29 == (char *)0x0) {
    pcVar29 = (char *)&QByteArray::_empty;
  }
  uVar23 = res_nmkquery(&state,0,pcVar29,1,this->requestType,0,0,0,(QArrayData *)&qbuffer,0x120);
  if (-1 < (int)uVar23) {
    puVar2 = qbuffer._M_elems + uVar23;
    puVar2[0] = '\0';
    puVar2[1] = '\0';
    puVar2[2] = ')';
    puVar2[3] = '\x04';
    puVar2[4] = 0xd0;
    puVar2[5] = '\0';
    puVar2[6] = '\0';
    puVar2[7] = '\0';
    puVar2 = qbuffer._M_elems + (ulong)uVar23 + 7;
    puVar2[0] = '\0';
    puVar2[1] = '\0';
    puVar2[2] = '\0';
    puVar2[3] = '\0';
    qbuffer._M_elems[10] = '\0';
    qbuffer._M_elems[0xb] = '\x01';
    uVar23 = uVar23 + 0xb;
  }
  if ((int)uVar23 < 0) {
    QDnsLookupReply::makeResolverSystemError(reply_local,-1);
  }
  else {
    memset(&buffer,0xaa,0x4e8);
    buffer.super_QVLABase<unsigned_char>.super_QVLABaseBase.a = 0x4d0;
    buffer.super_QVLABase<unsigned_char>.super_QVLABaseBase.ptr =
         &buffer.super_QVLAStorage<1UL,_1UL,_1232LL>;
    buffer.super_QVLABase<unsigned_char>.super_QVLABaseBase.s = 0x4d0;
    responseLength = -1;
    if (this->protocol == DnsOverTls) {
      query.super_QSpanBase<unsigned_char,_18446744073709551615UL>.m_size._0_4_ = uVar23;
      query.super_QSpanBase<unsigned_char,_18446744073709551615UL>.m_data = qbuffer._M_elems;
      query.super_QSpanBase<unsigned_char,_18446744073709551615UL>.m_size._4_4_ = 0;
      bVar20 = sendDnsOverTls(this,reply_local,query,&buffer);
      if (bVar20) {
        responseLength = (int)buffer.super_QVLABase<unsigned_char>.super_QVLABaseBase.s;
        iVar22 = responseLength;
        goto LAB_00235c9f;
      }
    }
    else {
      iVar22 = responseLength;
      if (this->protocol == Standard) {
        uVar21 = this->port;
        this_01 = &this->nameserver;
        record.d.d.ptr =
             (QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate>)
             (QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate>)reply_local;
        local_8f8.d.d = (Data *)&qbuffer;
        local_8f8.d.ptr = (char16_t *)(ulong)uVar23;
        response = (uchar *)&state;
        bVar20 = QHostAddress::isNull(this_01);
        puVar2 = response;
        if (!bVar20) {
          puVar2[0x10] = '\x01';
          puVar2[0x11] = '\0';
          puVar2[0x12] = '\0';
          puVar2[0x13] = '\0';
          puVar2[0x14] = '\0';
          puVar2[0x15] = '\0';
          NVar24 = QHostAddress::protocol(this_01);
          if (NVar24 == IPv6Protocol) {
            bVar20 = setIpv6NameServer<__res_state>((__res_state *)puVar2,this_01,uVar21);
            QVar17 = record;
            if (!bVar20) {
              iVar22 = -1;
              QMetaObject::tr((char *)&local_8c8,(char *)&QDnsLookup::staticMetaObject,0x280c25);
              *(undefined4 *)QVar17.d.d.ptr = 1;
              pRVar9 = *(ReplyBuffer **)((long)QVar17.d.d.ptr + 8);
              *(Data **)((long)QVar17.d.d.ptr + 8) = local_8c8.cache.d.d;
              pQVar10 = *(QDnsCachedName **)((long)QVar17.d.d.ptr + 0x10);
              *(QDnsCachedName **)((long)QVar17.d.d.ptr + 0x10) = local_8c8.cache.d.ptr;
              pQVar11 = *(QString **)((long)QVar17.d.d.ptr + 0x18);
              *(qsizetype *)((long)QVar17.d.d.ptr + 0x18) = local_8c8.cache.d.size;
              local_8c8.cache.d.d = (Data *)pRVar9;
              local_8c8.cache.d.ptr = pQVar10;
              local_8c8.cache.d.size = (qsizetype)pQVar11;
              if (pRVar9 != (ReplyBuffer *)0x0) {
                LOCK();
                ((__atomic_base<int> *)&(pRVar9->super_QVLABase<unsigned_char>).super_QVLABaseBase.a
                )->_M_i = ((__atomic_base<int> *)
                          &(pRVar9->super_QVLABase<unsigned_char>).super_QVLABaseBase.a)->_M_i + -1;
                UNLOCK();
                if (((__atomic_base<int> *)
                    &(pRVar9->super_QVLABase<unsigned_char>).super_QVLABaseBase.a)->_M_i == 0) {
                  QArrayData::deallocate((QArrayData *)pRVar9,2,0x10);
                }
              }
              goto LAB_00235c9f;
            }
          }
          else {
            puVar2[0x14] = '\0';
            puVar2[0x15] = '\0';
            puVar2[0x16] = '\0';
            puVar2[0x17] = '\0';
            puVar2[0x18] = '\0';
            puVar2[0x19] = '\0';
            puVar2[0x1a] = '\0';
            puVar2[0x1b] = '\0';
            puVar2[0x1c] = '\0';
            puVar2[0x1d] = '\0';
            puVar2[0x1e] = '\0';
            puVar2[0x1f] = '\0';
            puVar2[0x20] = '\0';
            puVar2[0x21] = '\0';
            puVar2[0x22] = '\0';
            puVar2[0x23] = '\0';
            puVar2[0x14] = '\x02';
            puVar2[0x15] = '\0';
            *(ushort *)(puVar2 + 0x16) = uVar21 << 8 | uVar21 >> 8;
            qVar25 = QHostAddress::toIPv4Address(this_01,(bool *)0x0);
            *(quint32 *)(puVar2 + 0x18) =
                 qVar25 >> 0x18 | (qVar25 & 0xff0000) >> 8 | (qVar25 & 0xff00) << 8 | qVar25 << 0x18
            ;
          }
          *(ulong *)buffer.super_QVLABase<unsigned_char>.super_QVLABaseBase.ptr =
               *buffer.super_QVLABase<unsigned_char>.super_QVLABaseBase.ptr | 0x20000000;
          *(ulong *)(response + 8) = *(ulong *)(response + 8) | 0x4000000;
        }
        local_8c8.cache.d.ptr = (QDnsCachedName *)&response;
        local_8c8.cache.d.size = (qsizetype)&local_8f8;
        local_8c8.response = (uchar **)&record;
        *(ulong *)(response + 8) = *(ulong *)(response + 8) | 0x20;
        local_8c8.cache.d.d = (Data *)&buffer;
        iVar22 = sendStandardDns::anon_class_32_4_ea28d3fd::operator()
                           ((anon_class_32_4_ea28d3fd *)&local_8c8);
        if (-1 < iVar22) {
          puVar31 = (undefined4 *)buffer.super_QVLABase<unsigned_char>.super_QVLABaseBase.ptr;
          if ((*buffer.super_QVLABase<unsigned_char>.super_QVLABaseBase.ptr & 0xf020000) == 0x20000)
          {
            qVar33 = buffer.super_QVLABase<unsigned_char>.super_QVLABaseBase.a;
            if (buffer.super_QVLABase<unsigned_char>.super_QVLABaseBase.a < 0x10000) {
              qVar33 = 0xffff;
            }
            QVLABase<unsigned_char>::reallocate_impl
                      (&buffer.super_QVLABase<unsigned_char>,0x4d0,
                       &buffer.super_QVLAStorage<1UL,_1UL,_1232LL>,0xffff,qVar33);
            puVar31 = (undefined4 *)buffer.super_QVLABase<unsigned_char>.super_QVLABaseBase.ptr;
            buffer.super_QVLABase<unsigned_char>.super_QVLABaseBase.s = 0xffff;
            *(uint *)((long)local_8f8.d.d + 8) =
                 (uint)(ushort)*(qsizetype *)((long)local_8f8.d.d + 8);
            local_8f8.d.ptr = (char16_t *)((long)local_8f8.d.ptr + -0xb);
            *(ulong *)(response + 8) = *(ulong *)(response + 8) | 8;
            iVar22 = sendStandardDns::anon_class_32_4_ea28d3fd::operator()
                               ((anon_class_32_4_ea28d3fd *)&local_8c8);
            if (buffer.super_QVLABase<unsigned_char>.super_QVLABaseBase.s < iVar22) {
              QDnsLookupRunnable::query((QDnsLookupRunnable *)&record);
              iVar22 = -1;
              goto LAB_00235c9f;
            }
          }
          *(byte *)((long)record.d.d.ptr + 4) = (byte)((uint)*puVar31 >> 0x1d) & 1;
        }
      }
LAB_00235c9f:
      responseLength = iVar22;
      pvVar19 = buffer.super_QVLABase<unsigned_char>.super_QVLABaseBase.ptr;
      if (-1 < responseLength) {
        if (responseLength < 0xc) {
          local_8c8.cache.d.d = (Data *)0x0;
          local_8c8.cache.d.ptr = (QDnsCachedName *)0x0;
          local_8c8.cache.d.size = 0;
          QDnsLookupReply::makeInvalidReplyError(reply_local,(QString *)&local_8c8);
          if ((ReplyBuffer *)local_8c8.cache.d.d != (ReplyBuffer *)0x0) {
            LOCK();
            *(int *)&(((QVLABase<unsigned_char> *)&(local_8c8.cache.d.d)->super_QArrayData)->
                     super_QVLABaseBase).a =
                 (int)(((QVLABase<unsigned_char> *)&(local_8c8.cache.d.d)->super_QArrayData)->
                      super_QVLABaseBase).a + -1;
            UNLOCK();
            if ((int)(((QVLABase<unsigned_char> *)&(local_8c8.cache.d.d)->super_QArrayData)->
                     super_QVLABaseBase).a == 0) {
              QArrayData::deallocate(&(local_8c8.cache.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
        else if ((*(byte *)((long)buffer.super_QVLABase<unsigned_char>.super_QVLABaseBase.ptr + 3) &
                 0xf) == 0) {
          local_8c8.response = &response;
          response = (uchar *)buffer.super_QVLABase<unsigned_char>.super_QVLABaseBase.ptr;
          local_8c8.status = &status;
          status = -0x55555556;
          local_8c8.cache.d.d = (Data *)0x0;
          local_8c8.cache.d.ptr = (QDnsCachedName *)0x0;
          local_8c8.cache.d.size = 0;
          local_8c8.responseLength = &responseLength;
          local_8c8.reply = &reply_local;
          lVar35 = 0xc;
          if (*(short *)((long)buffer.super_QVLABase<unsigned_char>.super_QVLABaseBase.ptr + 4) ==
              0x100) {
            QDnsLookupRunnable::query::anon_class_56_5_c3b57c2e::operator()
                      (&local_8e0,&local_8c8,0xc);
            if ((totally_ordered_wrapper<QHostAddressPrivate_*>)local_8e0.d.d !=
                (totally_ordered_wrapper<QHostAddressPrivate_*>)0x0) {
              LOCK();
              *(int *)local_8e0.d.d = *(int *)local_8e0.d.d + -1;
              UNLOCK();
              if (*(int *)local_8e0.d.d == 0) {
                QArrayData::deallocate(&(local_8e0.d.d)->super_QArrayData,2,0x10);
              }
            }
            if (-1 < status) {
              lVar35 = (ulong)(uint)status + 0x10;
              if (responseLength < lVar35) {
                *(ulong *)pvVar19 = *pvVar19 | 0xffff00000000;
                lVar35 = 0xc;
              }
              goto LAB_00235e32;
            }
          }
          else {
LAB_00235e32:
            uVar12 = *pvVar19;
            uVar21 = (ushort)(uVar12 >> 0x20);
            if ((ushort)(uVar21 << 8 | uVar21 >> 8) < 2) {
              if (uVar12 >> 0x30 != 0 && lVar35 < responseLength) {
                uVar21 = (ushort)(uVar12 >> 0x30);
                iVar22 = 0;
                do {
                  local_8f8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                  local_8f8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                  local_8f8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                  QDnsLookupRunnable::query::anon_class_56_5_c3b57c2e::operator()
                            (&local_8f8,&local_8c8,lVar35);
                  pQVar18 = reply_local;
                  lVar26 = (long)status;
                  iVar30 = 1;
                  if (-1 < lVar26) {
                    lVar36 = lVar26 + lVar35;
                    lVar26 = lVar26 + lVar35;
                    lVar34 = lVar26 + 10;
                    lVar35 = lVar36;
                    if (lVar34 <= responseLength) {
                      uVar5 = *(ushort *)(response + lVar36 + 8);
                      uVar32 = uVar5 << 8 | uVar5 >> 8;
                      lVar1 = lVar34 + (ulong)uVar32;
                      lVar35 = lVar34;
                      if (lVar1 <= responseLength) {
                        if (*(short *)(response + lVar36 + 2) == 0x100) {
                          uVar27 = *(ushort *)(response + lVar36) << 8 |
                                   *(ushort *)(response + lVar36) >> 8;
                          uVar23 = *(uint *)(response + lVar36 + 4);
                          uVar23 = uVar23 >> 0x18 | (uVar23 & 0xff0000) >> 8 |
                                   (uVar23 & 0xff00) << 8 | uVar23 << 0x18;
                          if (uVar27 < 0xf) {
                            if (uVar27 < 5) {
                              if (uVar27 == 1) {
                                if (uVar5 != 0x400) {
                                  iVar30 = 0x280b36;
                                  goto LAB_0023686c;
                                }
                                uVar7 = *(uint *)(response + lVar34);
                                record.d.d.ptr =
                                     (QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate>)
                                     &DAT_aaaaaaaaaaaaaaaa;
                                QDnsHostAddressRecord::QDnsHostAddressRecord
                                          ((QDnsHostAddressRecord *)&record);
                                if ((record.d.d.ptr !=
                                     (totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*>)0x0
                                    ) && (*(int *)record.d.d.ptr != 1)) {
                                  QSharedDataPointer<QDnsHostAddressRecordPrivate>::detach_helper
                                            ((QSharedDataPointer<QDnsHostAddressRecordPrivate> *)
                                             &record);
                                }
                                QString::operator=((QString *)((long)record.d.d.ptr + 8),
                                                   (QString *)&local_8f8);
                                if ((record.d.d.ptr !=
                                     (totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*>)0x0
                                    ) && (*(int *)record.d.d.ptr != 1)) {
                                  QSharedDataPointer<QDnsHostAddressRecordPrivate>::detach_helper
                                            ((QSharedDataPointer<QDnsHostAddressRecordPrivate> *)
                                             &record);
                                }
                                *(uint *)((long)record.d.d.ptr + 0x20) = uVar23;
                                QHostAddress::QHostAddress
                                          ((QHostAddress *)&record_1,
                                           uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 |
                                           (uVar7 & 0xff00) << 8 | uVar7 << 0x18);
LAB_00236622:
                                if ((record.d.d.ptr !=
                                     (totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*>)0x0
                                    ) && (*(int *)record.d.d.ptr != 1)) {
                                  QSharedDataPointer<QDnsHostAddressRecordPrivate>::detach_helper
                                            ((QSharedDataPointer<QDnsHostAddressRecordPrivate> *)
                                             &record);
                                }
                                QVar13.d.ptr = (totally_ordered_wrapper<QDnsTextRecordPrivate_*>)
                                               ((totally_ordered_wrapper<QDnsTextRecordPrivate_*> *)
                                               ((long)record.d.d.ptr + 0x28))->ptr;
                                ((QSharedDataPointer<QDnsTextRecordPrivate> *)
                                ((long)record.d.d.ptr + 0x28))->d =
                                     (totally_ordered_wrapper<QDnsTextRecordPrivate_*>)
                                     record_1.d.d.ptr;
                                record_1.d.d.ptr =
                                     (QSharedDataPointer<QDnsTextRecordPrivate>)
                                     (QSharedDataPointer<QDnsTextRecordPrivate>)QVar13.d.ptr;
                                QHostAddress::~QHostAddress((QHostAddress *)&record_1);
                                QList<QDnsHostAddressRecord>::append
                                          (&reply_local->hostAddressRecords,(parameter_type)&record)
                                ;
                                QDnsHostAddressRecord::~QDnsHostAddressRecord
                                          ((QDnsHostAddressRecord *)&record);
                              }
                              else if (uVar27 == 2) {
                                record_1.d.d.ptr =
                                     (QSharedDataPointer<QDnsTextRecordPrivate>)
                                     &DAT_aaaaaaaaaaaaaaaa;
                                QDnsDomainNameRecord::QDnsDomainNameRecord
                                          ((QDnsDomainNameRecord *)&record_1);
                                if ((record_1.d.d.ptr !=
                                     (totally_ordered_wrapper<QDnsTextRecordPrivate_*>)0x0) &&
                                   (*(int *)record_1.d.d.ptr != 1)) {
                                  QSharedDataPointer<QDnsDomainNameRecordPrivate>::detach_helper
                                            ((QSharedDataPointer<QDnsDomainNameRecordPrivate> *)
                                             &record_1);
                                }
                                QString::operator=((QString *)((long)record_1.d.d.ptr + 8),
                                                   (QString *)&local_8f8);
                                if ((record_1.d.d.ptr !=
                                     (totally_ordered_wrapper<QDnsTextRecordPrivate_*>)0x0) &&
                                   (*(int *)record_1.d.d.ptr != 1)) {
                                  QSharedDataPointer<QDnsDomainNameRecordPrivate>::detach_helper
                                            ((QSharedDataPointer<QDnsDomainNameRecordPrivate> *)
                                             &record_1);
                                }
                                *(uint *)((long)record_1.d.d.ptr + 0x20) = uVar23;
                                QDnsLookupRunnable::query::anon_class_56_5_c3b57c2e::operator()
                                          ((QString *)&record,&local_8c8,lVar34);
                                if ((record_1.d.d.ptr !=
                                     (totally_ordered_wrapper<QDnsTextRecordPrivate_*>)0x0) &&
                                   (*(int *)record_1.d.d.ptr != 1)) {
                                  QSharedDataPointer<QDnsDomainNameRecordPrivate>::detach_helper
                                            ((QSharedDataPointer<QDnsDomainNameRecordPrivate> *)
                                             &record_1);
                                }
                                QVar14.d.ptr = (totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*>
                                                )((
                                                  totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*>
                                                  *)((long)record_1.d.d.ptr + 0x28))->ptr;
                                pcVar15 = *(char16_t **)((long)record_1.d.d.ptr + 0x30);
                                ((QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate> *)
                                ((long)record_1.d.d.ptr + 0x28))->d =
                                     (totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*>)
                                     record.d.d.ptr;
                                *(char16_t **)((long)record_1.d.d.ptr + 0x30) = pcStack_910;
                                qVar33 = *(qsizetype *)((long)record_1.d.d.ptr + 0x38);
                                *(qsizetype *)((long)record_1.d.d.ptr + 0x38) = local_908;
                                record.d.d.ptr =
                                     (QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate>)
                                     (QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate>)
                                     QVar14.d.ptr;
                                if (QVar14.d.ptr != (QDnsTlsAssociationRecordPrivate *)0x0) {
                                  LOCK();
                                  *(int *)QVar14.d.ptr = *(int *)QVar14.d.ptr + -1;
                                  UNLOCK();
                                  if (*(int *)QVar14.d.ptr == 0) {
                                    QArrayData::deallocate((QArrayData *)QVar14.d.ptr,2,0x10);
                                  }
                                }
                                pcStack_910 = pcVar15;
                                local_908 = qVar33;
                                if (status < 0) {
                                  iVar28 = 0x280b8c;
                                  goto LAB_00236b5f;
                                }
                                this_02 = &reply_local->nameServerRecords;
                                goto LAB_00236577;
                              }
                            }
                            else {
                              if (uVar27 == 5) {
                                record_1.d.d.ptr =
                                     (QSharedDataPointer<QDnsTextRecordPrivate>)
                                     &DAT_aaaaaaaaaaaaaaaa;
                                QDnsDomainNameRecord::QDnsDomainNameRecord
                                          ((QDnsDomainNameRecord *)&record_1);
                                if ((record_1.d.d.ptr !=
                                     (totally_ordered_wrapper<QDnsTextRecordPrivate_*>)0x0) &&
                                   (*(int *)record_1.d.d.ptr != 1)) {
                                  QSharedDataPointer<QDnsDomainNameRecordPrivate>::detach_helper
                                            ((QSharedDataPointer<QDnsDomainNameRecordPrivate> *)
                                             &record_1);
                                }
                                QString::operator=((QString *)((long)record_1.d.d.ptr + 8),
                                                   (QString *)&local_8f8);
                                if ((record_1.d.d.ptr !=
                                     (totally_ordered_wrapper<QDnsTextRecordPrivate_*>)0x0) &&
                                   (*(int *)record_1.d.d.ptr != 1)) {
                                  QSharedDataPointer<QDnsDomainNameRecordPrivate>::detach_helper
                                            ((QSharedDataPointer<QDnsDomainNameRecordPrivate> *)
                                             &record_1);
                                }
                                *(uint *)((long)record_1.d.d.ptr + 0x20) = uVar23;
                                QDnsLookupRunnable::query::anon_class_56_5_c3b57c2e::operator()
                                          ((QString *)&record,&local_8c8,lVar34);
                                if ((record_1.d.d.ptr !=
                                     (totally_ordered_wrapper<QDnsTextRecordPrivate_*>)0x0) &&
                                   (*(int *)record_1.d.d.ptr != 1)) {
                                  QSharedDataPointer<QDnsDomainNameRecordPrivate>::detach_helper
                                            ((QSharedDataPointer<QDnsDomainNameRecordPrivate> *)
                                             &record_1);
                                }
                                QVar14.d.ptr = (totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*>
                                                )((
                                                  totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*>
                                                  *)((long)record_1.d.d.ptr + 0x28))->ptr;
                                pcVar15 = *(char16_t **)((long)record_1.d.d.ptr + 0x30);
                                ((QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate> *)
                                ((long)record_1.d.d.ptr + 0x28))->d =
                                     (totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*>)
                                     record.d.d.ptr;
                                *(char16_t **)((long)record_1.d.d.ptr + 0x30) = pcStack_910;
                                qVar33 = *(qsizetype *)((long)record_1.d.d.ptr + 0x38);
                                *(qsizetype *)((long)record_1.d.d.ptr + 0x38) = local_908;
                                record.d.d.ptr =
                                     (QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate>)
                                     (QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate>)
                                     QVar14.d.ptr;
                                if (QVar14.d.ptr != (QDnsTlsAssociationRecordPrivate *)0x0) {
                                  LOCK();
                                  *(int *)QVar14.d.ptr = *(int *)QVar14.d.ptr + -1;
                                  UNLOCK();
                                  if (*(int *)QVar14.d.ptr == 0) {
                                    QArrayData::deallocate((QArrayData *)QVar14.d.ptr,2,0x10);
                                  }
                                }
                                pcStack_910 = pcVar15;
                                local_908 = qVar33;
                                if (-1 < status) {
                                  this_02 = &reply_local->canonicalNameRecords;
                                  goto LAB_00236577;
                                }
                                iVar28 = 0x280b6e;
LAB_00236b5f:
                                pQVar18 = reply_local;
                                iVar30 = status;
                                QMetaObject::tr((char *)&record,
                                                (char *)&QDnsLookup::staticMetaObject,iVar28);
                                QDnsLookupReply::makeInvalidReplyError(pQVar18,(QString *)&record);
                                if (record.d.d.ptr !=
                                    (totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*>)0x0)
                                {
                                  LOCK();
                                  *(int *)record.d.d.ptr = *(int *)record.d.d.ptr + -1;
                                  UNLOCK();
                                  if (*(int *)record.d.d.ptr == 0) {
                                    QArrayData::deallocate((QArrayData *)record.d.d.ptr,2,0x10);
                                  }
                                }
                              }
                              else {
                                if (uVar27 != 0xc) goto LAB_00236c6e;
                                record_1.d.d.ptr =
                                     (QSharedDataPointer<QDnsTextRecordPrivate>)
                                     &DAT_aaaaaaaaaaaaaaaa;
                                QDnsDomainNameRecord::QDnsDomainNameRecord
                                          ((QDnsDomainNameRecord *)&record_1);
                                if ((record_1.d.d.ptr !=
                                     (totally_ordered_wrapper<QDnsTextRecordPrivate_*>)0x0) &&
                                   (*(int *)record_1.d.d.ptr != 1)) {
                                  QSharedDataPointer<QDnsDomainNameRecordPrivate>::detach_helper
                                            ((QSharedDataPointer<QDnsDomainNameRecordPrivate> *)
                                             &record_1);
                                }
                                QString::operator=((QString *)((long)record_1.d.d.ptr + 8),
                                                   (QString *)&local_8f8);
                                if ((record_1.d.d.ptr !=
                                     (totally_ordered_wrapper<QDnsTextRecordPrivate_*>)0x0) &&
                                   (*(int *)record_1.d.d.ptr != 1)) {
                                  QSharedDataPointer<QDnsDomainNameRecordPrivate>::detach_helper
                                            ((QSharedDataPointer<QDnsDomainNameRecordPrivate> *)
                                             &record_1);
                                }
                                *(uint *)((long)record_1.d.d.ptr + 0x20) = uVar23;
                                QDnsLookupRunnable::query::anon_class_56_5_c3b57c2e::operator()
                                          ((QString *)&record,&local_8c8,lVar34);
                                if ((record_1.d.d.ptr !=
                                     (totally_ordered_wrapper<QDnsTextRecordPrivate_*>)0x0) &&
                                   (*(int *)record_1.d.d.ptr != 1)) {
                                  QSharedDataPointer<QDnsDomainNameRecordPrivate>::detach_helper
                                            ((QSharedDataPointer<QDnsDomainNameRecordPrivate> *)
                                             &record_1);
                                }
                                QVar14.d.ptr = (totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*>
                                                )((
                                                  totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*>
                                                  *)((long)record_1.d.d.ptr + 0x28))->ptr;
                                pcVar15 = *(char16_t **)((long)record_1.d.d.ptr + 0x30);
                                ((QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate> *)
                                ((long)record_1.d.d.ptr + 0x28))->d =
                                     (totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*>)
                                     record.d.d.ptr;
                                *(char16_t **)((long)record_1.d.d.ptr + 0x30) = pcStack_910;
                                qVar33 = *(qsizetype *)((long)record_1.d.d.ptr + 0x38);
                                *(qsizetype *)((long)record_1.d.d.ptr + 0x38) = local_908;
                                record.d.d.ptr =
                                     (QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate>)
                                     (QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate>)
                                     QVar14.d.ptr;
                                if (QVar14.d.ptr != (QDnsTlsAssociationRecordPrivate *)0x0) {
                                  LOCK();
                                  *(int *)QVar14.d.ptr = *(int *)QVar14.d.ptr + -1;
                                  UNLOCK();
                                  if (*(int *)QVar14.d.ptr == 0) {
                                    QArrayData::deallocate((QArrayData *)QVar14.d.ptr,2,0x10);
                                  }
                                }
                                pcStack_910 = pcVar15;
                                local_908 = qVar33;
                                if (status < 0) {
                                  iVar28 = 0x280ba7;
                                  goto LAB_00236b5f;
                                }
                                this_02 = &reply_local->pointerRecords;
LAB_00236577:
                                iVar30 = status;
                                QList<QDnsDomainNameRecord>::append
                                          (this_02,(parameter_type)&record_1);
                              }
                              QDnsDomainNameRecord::~QDnsDomainNameRecord
                                        ((QDnsDomainNameRecord *)&record_1);
LAB_00236c6a:
                              if (iVar30 < 0) goto LAB_00236cce;
                            }
LAB_00236c6e:
                            iVar22 = iVar22 + 1;
                            iVar30 = 0;
                            lVar35 = lVar1;
                          }
                          else {
                            if (uVar27 < 0x1c) {
                              if (uVar27 != 0xf) {
                                if (uVar27 == 0x10) {
                                  record_1.d.d.ptr =
                                       (QSharedDataPointer<QDnsTextRecordPrivate>)
                                       &DAT_aaaaaaaaaaaaaaaa;
                                  QDnsTextRecord::QDnsTextRecord(&record_1);
                                  if ((record_1.d.d.ptr !=
                                       (totally_ordered_wrapper<QDnsTextRecordPrivate_*>)0x0) &&
                                     (*(int *)record_1.d.d.ptr != 1)) {
                                    QSharedDataPointer<QDnsTextRecordPrivate>::detach_helper
                                              (&record_1.d);
                                  }
                                  QString::operator=((QString *)((long)record_1.d.d.ptr + 8),
                                                     (QString *)&local_8f8);
                                  if ((record_1.d.d.ptr !=
                                       (totally_ordered_wrapper<QDnsTextRecordPrivate_*>)0x0) &&
                                     (*(int *)record_1.d.d.ptr != 1)) {
                                    QSharedDataPointer<QDnsTextRecordPrivate>::detach_helper
                                              (&record_1.d);
                                  }
                                  *(uint *)((long)record_1.d.d.ptr + 0x20) = uVar23;
                                  do {
                                    lVar26 = lVar34;
                                    pQVar18 = reply_local;
                                    if (lVar1 <= lVar26) {
                                      QList<QDnsTextRecord>::append
                                                (&reply_local->textRecords,&record_1);
                                      break;
                                    }
                                    bVar3 = response[lVar26];
                                    lVar34 = lVar26 + 1;
                                    lVar36 = lVar26 + (ulong)bVar3 + 1;
                                    if (lVar1 < lVar36) {
                                      QMetaObject::tr((char *)&record,
                                                      (char *)&QDnsLookup::staticMetaObject,0x280c11
                                                     );
                                      QDnsLookupReply::makeInvalidReplyError
                                                (pQVar18,(QString *)&record);
                                      if (record.d.d.ptr !=
                                          (totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*>
                                           )0x0) {
                                        LOCK();
                                        *(int *)record.d.d.ptr = *(int *)record.d.d.ptr + -1;
                                        UNLOCK();
                                        if (*(int *)record.d.d.ptr == 0) {
                                          QArrayData::deallocate
                                                    ((QArrayData *)record.d.d.ptr,2,0x10);
                                        }
                                      }
                                    }
                                    else {
                                      if ((record_1.d.d.ptr !=
                                           (totally_ordered_wrapper<QDnsTextRecordPrivate_*>)0x0) &&
                                         (*(int *)record_1.d.d.ptr != 1)) {
                                        QSharedDataPointer<QDnsTextRecordPrivate>::detach_helper
                                                  (&record_1.d);
                                      }
                                      QVar16.d.d.ptr = record_1.d.d.ptr;
                                      this_00 = (QList<QByteArray> *)((long)record_1.d.d.ptr + 0x28)
                                      ;
                                      QByteArray::QByteArray
                                                ((QByteArray *)&record,(char *)(response + lVar34),
                                                 (ulong)bVar3);
                                      QtPrivate::QMovableArrayOps<QByteArray>::emplace<QByteArray>
                                                ((QMovableArrayOps<QByteArray> *)this_00,
                                                 *(qsizetype *)((long)QVar16.d.d.ptr + 0x38),
                                                 (QByteArray *)&record);
                                      QList<QByteArray>::end(this_00);
                                      lVar34 = lVar36;
                                      if (record.d.d.ptr !=
                                          (totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*>
                                           )0x0) {
                                        LOCK();
                                        *(int *)record.d.d.ptr = *(int *)record.d.d.ptr + -1;
                                        UNLOCK();
                                        if (*(int *)record.d.d.ptr == 0) {
                                          QArrayData::deallocate
                                                    ((QArrayData *)record.d.d.ptr,1,0x10);
                                        }
                                      }
                                    }
                                  } while (lVar36 <= lVar1);
                                  QDnsTextRecord::~QDnsTextRecord(&record_1);
                                  if (lVar26 < lVar1) goto LAB_00236cce;
                                }
                                goto LAB_00236c6e;
                              }
                              uVar5 = *(ushort *)(response + lVar36 + 10);
                              record_1.d.d.ptr =
                                   (QSharedDataPointer<QDnsTextRecordPrivate>)&DAT_aaaaaaaaaaaaaaaa;
                              QDnsMailExchangeRecord::QDnsMailExchangeRecord
                                        ((QDnsMailExchangeRecord *)&record_1);
                              QDnsLookupRunnable::query::anon_class_56_5_c3b57c2e::operator()
                                        ((QString *)&record,&local_8c8,lVar36 + 0xc);
                              if ((record_1.d.d.ptr !=
                                   (totally_ordered_wrapper<QDnsTextRecordPrivate_*>)0x0) &&
                                 (*(int *)record_1.d.d.ptr != 1)) {
                                QSharedDataPointer<QDnsMailExchangeRecordPrivate>::detach_helper
                                          ((QSharedDataPointer<QDnsMailExchangeRecordPrivate> *)
                                           &record_1);
                              }
                              QVar14.d.ptr = (totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*>
                                              )((totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*>
                                                 *)((long)record_1.d.d.ptr + 0x28))->ptr;
                              pcVar15 = *(char16_t **)((long)record_1.d.d.ptr + 0x30);
                              ((QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate> *)
                              ((long)record_1.d.d.ptr + 0x28))->d =
                                   (totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*>)
                                   record.d.d.ptr;
                              *(char16_t **)((long)record_1.d.d.ptr + 0x30) = pcStack_910;
                              qVar33 = *(qsizetype *)((long)record_1.d.d.ptr + 0x38);
                              *(qsizetype *)((long)record_1.d.d.ptr + 0x38) = local_908;
                              record.d.d.ptr =
                                   (QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate>)
                                   (QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate>)
                                   QVar14.d.ptr;
                              if (QVar14.d.ptr != (QDnsTlsAssociationRecordPrivate *)0x0) {
                                LOCK();
                                *(int *)QVar14.d.ptr = *(int *)QVar14.d.ptr + -1;
                                UNLOCK();
                                if (*(int *)QVar14.d.ptr == 0) {
                                  QArrayData::deallocate((QArrayData *)QVar14.d.ptr,2,0x10);
                                }
                              }
                              if ((record_1.d.d.ptr !=
                                   (totally_ordered_wrapper<QDnsTextRecordPrivate_*>)0x0) &&
                                 (*(int *)record_1.d.d.ptr != 1)) {
                                QSharedDataPointer<QDnsMailExchangeRecordPrivate>::detach_helper
                                          ((QSharedDataPointer<QDnsMailExchangeRecordPrivate> *)
                                           &record_1);
                              }
                              QString::operator=((QString *)((long)record_1.d.d.ptr + 8),
                                                 (QString *)&local_8f8);
                              if ((record_1.d.d.ptr !=
                                   (totally_ordered_wrapper<QDnsTextRecordPrivate_*>)0x0) &&
                                 (*(int *)record_1.d.d.ptr != 1)) {
                                QSharedDataPointer<QDnsMailExchangeRecordPrivate>::detach_helper
                                          ((QSharedDataPointer<QDnsMailExchangeRecordPrivate> *)
                                           &record_1);
                              }
                              *(ushort *)((long)record_1.d.d.ptr + 0x40) = uVar5 << 8 | uVar5 >> 8;
                              if ((record_1.d.d.ptr !=
                                   (totally_ordered_wrapper<QDnsTextRecordPrivate_*>)0x0) &&
                                 (*(int *)record_1.d.d.ptr != 1)) {
                                QSharedDataPointer<QDnsMailExchangeRecordPrivate>::detach_helper
                                          ((QSharedDataPointer<QDnsMailExchangeRecordPrivate> *)
                                           &record_1);
                              }
                              pQVar18 = reply_local;
                              iVar30 = status;
                              *(uint *)((long)record_1.d.d.ptr + 0x20) = uVar23;
                              if (status < 0) {
                                QMetaObject::tr((char *)&record,
                                                (char *)&QDnsLookup::staticMetaObject,0x280bbe);
                                QDnsLookupReply::makeInvalidReplyError(pQVar18,(QString *)&record);
                                if (record.d.d.ptr !=
                                    (totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*>)0x0)
                                {
                                  LOCK();
                                  *(int *)record.d.d.ptr = *(int *)record.d.d.ptr + -1;
                                  UNLOCK();
                                  if (*(int *)record.d.d.ptr == 0) {
                                    QArrayData::deallocate((QArrayData *)record.d.d.ptr,2,0x10);
                                  }
                                }
                              }
                              else {
                                QList<QDnsMailExchangeRecord>::append
                                          (&reply_local->mailExchangeRecords,
                                           (parameter_type)&record_1);
                              }
                              QDnsMailExchangeRecord::~QDnsMailExchangeRecord
                                        ((QDnsMailExchangeRecord *)&record_1);
                              pcStack_910 = pcVar15;
                              local_908 = qVar33;
                              goto LAB_00236c6a;
                            }
                            if (uVar27 == 0x1c) {
                              if (uVar5 == 0x1000) {
                                record.d.d.ptr =
                                     (QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate>)
                                     &DAT_aaaaaaaaaaaaaaaa;
                                QDnsHostAddressRecord::QDnsHostAddressRecord
                                          ((QDnsHostAddressRecord *)&record);
                                if ((record.d.d.ptr !=
                                     (totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*>)0x0
                                    ) && (*(int *)record.d.d.ptr != 1)) {
                                  QSharedDataPointer<QDnsHostAddressRecordPrivate>::detach_helper
                                            ((QSharedDataPointer<QDnsHostAddressRecordPrivate> *)
                                             &record);
                                }
                                QString::operator=((QString *)((long)record.d.d.ptr + 8),
                                                   (QString *)&local_8f8);
                                if ((record.d.d.ptr !=
                                     (totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*>)0x0
                                    ) && (*(int *)record.d.d.ptr != 1)) {
                                  QSharedDataPointer<QDnsHostAddressRecordPrivate>::detach_helper
                                            ((QSharedDataPointer<QDnsHostAddressRecordPrivate> *)
                                             &record);
                                }
                                *(uint *)((long)record.d.d.ptr + 0x20) = uVar23;
                                QHostAddress::QHostAddress
                                          ((QHostAddress *)&record_1,response + lVar34);
                                goto LAB_00236622;
                              }
                              iVar30 = 0x280b52;
                            }
                            else {
                              if (uVar27 != 0x21) {
                                if (uVar27 == 0x34) {
                                  if (uVar32 < 3) {
                                    iVar30 = 0x280bf2;
                                    goto LAB_0023686c;
                                  }
                                  uVar6 = *(undefined2 *)(response + lVar36 + 10);
                                  uVar4 = response[lVar36 + 0xc];
                                  record.d.d.ptr =
                                       (QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate>
                                        )&DAT_aaaaaaaaaaaaaaaa;
                                  QDnsTlsAssociationRecord::QDnsTlsAssociationRecord(&record);
                                  QString::operator=((QString *)((long)record.d.d.ptr + 8),
                                                     (QString *)&local_8f8);
                                  QVar17 = record;
                                  *(uint *)((long)record.d.d.ptr + 0x20) = uVar23;
                                  *(undefined2 *)((long)record.d.d.ptr + 0x24) = uVar6;
                                  *(uchar *)((long)record.d.d.ptr + 0x26) = uVar4;
                                  QArrayDataPointer<char>::assign<unsigned_char*,q20::identity>
                                            ((QArrayDataPointer<char> *)
                                             ((long)record.d.d.ptr + 0x28),response + lVar26 + 0xd,
                                             response + lVar34 + (ulong)uVar32);
                                  lVar35 = *(long *)((long)QVar17.d.d.ptr + 0x30);
                                  if (lVar35 != 0) {
                                    *(undefined1 *)(lVar35 + *(long *)((long)QVar17.d.d.ptr + 0x38))
                                         = 0;
                                  }
                                  QList<QDnsTlsAssociationRecord>::append
                                            (&reply_local->tlsAssociationRecords,&record);
                                  QDnsTlsAssociationRecord::~QDnsTlsAssociationRecord(&record);
                                }
                                goto LAB_00236c6e;
                              }
                              if (6 < uVar32) {
                                uVar5 = *(ushort *)(response + lVar34);
                                uVar32 = *(ushort *)(response + lVar26 + 0xc);
                                uVar27 = *(ushort *)(response + lVar26 + 0xe);
                                record_1.d.d.ptr =
                                     (QSharedDataPointer<QDnsTextRecordPrivate>)
                                     &DAT_aaaaaaaaaaaaaaaa;
                                QDnsServiceRecord::QDnsServiceRecord((QDnsServiceRecord *)&record_1)
                                ;
                                if ((record_1.d.d.ptr !=
                                     (totally_ordered_wrapper<QDnsTextRecordPrivate_*>)0x0) &&
                                   (*(int *)record_1.d.d.ptr != 1)) {
                                  QSharedDataPointer<QDnsServiceRecordPrivate>::detach_helper
                                            ((QSharedDataPointer<QDnsServiceRecordPrivate> *)
                                             &record_1);
                                }
                                QString::operator=((QString *)((long)record_1.d.d.ptr + 8),
                                                   (QString *)&local_8f8);
                                QDnsLookupRunnable::query::anon_class_56_5_c3b57c2e::operator()
                                          ((QString *)&record,&local_8c8,lVar36 + 0x10);
                                if ((record_1.d.d.ptr !=
                                     (totally_ordered_wrapper<QDnsTextRecordPrivate_*>)0x0) &&
                                   (*(int *)record_1.d.d.ptr != 1)) {
                                  QSharedDataPointer<QDnsServiceRecordPrivate>::detach_helper
                                            ((QSharedDataPointer<QDnsServiceRecordPrivate> *)
                                             &record_1);
                                }
                                QVar14.d.ptr = (totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*>
                                                )((
                                                  totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*>
                                                  *)((long)record_1.d.d.ptr + 0x28))->ptr;
                                pcVar15 = *(char16_t **)((long)record_1.d.d.ptr + 0x30);
                                ((QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate> *)
                                ((long)record_1.d.d.ptr + 0x28))->d =
                                     (totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*>)
                                     record.d.d.ptr;
                                *(char16_t **)((long)record_1.d.d.ptr + 0x30) = pcStack_910;
                                qVar33 = *(qsizetype *)((long)record_1.d.d.ptr + 0x38);
                                *(qsizetype *)((long)record_1.d.d.ptr + 0x38) = local_908;
                                record.d.d.ptr =
                                     (QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate>)
                                     (QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate>)
                                     QVar14.d.ptr;
                                if (QVar14.d.ptr != (QDnsTlsAssociationRecordPrivate *)0x0) {
                                  LOCK();
                                  *(int *)QVar14.d.ptr = *(int *)QVar14.d.ptr + -1;
                                  UNLOCK();
                                  if (*(int *)QVar14.d.ptr == 0) {
                                    QArrayData::deallocate((QArrayData *)QVar14.d.ptr,2,0x10);
                                  }
                                }
                                if ((record_1.d.d.ptr !=
                                     (totally_ordered_wrapper<QDnsTextRecordPrivate_*>)0x0) &&
                                   (*(int *)record_1.d.d.ptr != 1)) {
                                  QSharedDataPointer<QDnsServiceRecordPrivate>::detach_helper
                                            ((QSharedDataPointer<QDnsServiceRecordPrivate> *)
                                             &record_1);
                                }
                                *(ushort *)((long)record_1.d.d.ptr + 0x40) =
                                     uVar27 << 8 | uVar27 >> 8;
                                if ((record_1.d.d.ptr !=
                                     (totally_ordered_wrapper<QDnsTextRecordPrivate_*>)0x0) &&
                                   (*(int *)record_1.d.d.ptr != 1)) {
                                  QSharedDataPointer<QDnsServiceRecordPrivate>::detach_helper
                                            ((QSharedDataPointer<QDnsServiceRecordPrivate> *)
                                             &record_1);
                                }
                                *(ushort *)((long)record_1.d.d.ptr + 0x42) = uVar5 << 8 | uVar5 >> 8
                                ;
                                if ((record_1.d.d.ptr !=
                                     (totally_ordered_wrapper<QDnsTextRecordPrivate_*>)0x0) &&
                                   (*(int *)record_1.d.d.ptr != 1)) {
                                  QSharedDataPointer<QDnsServiceRecordPrivate>::detach_helper
                                            ((QSharedDataPointer<QDnsServiceRecordPrivate> *)
                                             &record_1);
                                }
                                *(uint *)((long)record_1.d.d.ptr + 0x20) = uVar23;
                                if ((record_1.d.d.ptr !=
                                     (totally_ordered_wrapper<QDnsTextRecordPrivate_*>)0x0) &&
                                   (*(int *)record_1.d.d.ptr != 1)) {
                                  QSharedDataPointer<QDnsServiceRecordPrivate>::detach_helper
                                            ((QSharedDataPointer<QDnsServiceRecordPrivate> *)
                                             &record_1);
                                }
                                pQVar18 = reply_local;
                                iVar30 = status;
                                *(ushort *)((long)record_1.d.d.ptr + 0x44) =
                                     uVar32 << 8 | uVar32 >> 8;
                                if (status < 0) {
                                  QMetaObject::tr((char *)&record,
                                                  (char *)&QDnsLookup::staticMetaObject,0x280bdb);
                                  QDnsLookupReply::makeInvalidReplyError(pQVar18,(QString *)&record)
                                  ;
                                  if (record.d.d.ptr !=
                                      (totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*>)
                                      0x0) {
                                    LOCK();
                                    *(int *)record.d.d.ptr = *(int *)record.d.d.ptr + -1;
                                    UNLOCK();
                                    if (*(int *)record.d.d.ptr == 0) {
                                      QArrayData::deallocate((QArrayData *)record.d.d.ptr,2,0x10);
                                    }
                                  }
                                }
                                else {
                                  QList<QDnsServiceRecord>::append
                                            (&reply_local->serviceRecords,(parameter_type)&record_1)
                                  ;
                                }
                                QDnsServiceRecord::~QDnsServiceRecord
                                          ((QDnsServiceRecord *)&record_1);
                                pcStack_910 = pcVar15;
                                local_908 = qVar33;
                                goto LAB_00236c6a;
                              }
                              iVar30 = 0x280bdb;
                            }
LAB_0023686c:
                            QMetaObject::tr((char *)&record,(char *)&QDnsLookup::staticMetaObject,
                                            iVar30);
                            QDnsLookupReply::makeInvalidReplyError(pQVar18,(QString *)&record);
                            if (record.d.d.ptr !=
                                (totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*>)0x0) {
                              LOCK();
                              *(int *)record.d.d.ptr = *(int *)record.d.d.ptr + -1;
                              UNLOCK();
                              if (*(int *)record.d.d.ptr == 0) {
                                QArrayData::deallocate((QArrayData *)record.d.d.ptr,2,0x10);
                              }
                            }
LAB_00236cce:
                            iVar30 = 1;
                          }
                        }
                        else {
                          iVar30 = 3;
                        }
                      }
                    }
                  }
                  if (&(local_8f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_8f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                         = ((local_8f8.d.d)->super_QArrayData).ref_._q_value.
                           super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_8f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate(&(local_8f8.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                } while ((((iVar30 == 3) || (iVar30 == 0)) && (lVar35 < responseLength)) &&
                        (iVar22 < (int)(uint)(ushort)(uVar21 << 8 | uVar21 >> 8)));
              }
            }
            else {
              local_8f8.d.d = (Data *)0x0;
              local_8f8.d.ptr = (char16_t *)0x0;
              local_8f8.d.size = 0;
              QDnsLookupReply::makeInvalidReplyError(reply_local,&local_8f8);
              if (&(local_8f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_8f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_8f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_8f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_8f8.d.d)->super_QArrayData,2,0x10);
                }
              }
            }
          }
          QArrayDataPointer<(anonymous_namespace)::QDnsCachedName>::~QArrayDataPointer
                    ((QArrayDataPointer<(anonymous_namespace)::QDnsCachedName> *)&local_8c8);
        }
        else {
          QDnsLookupReply::makeDnsRcodeError
                    (reply_local,
                     *(byte *)((long)buffer.super_QVLABase<unsigned_char>.super_QVLABaseBase.ptr + 3
                              ) & 0xf);
        }
      }
    }
    if ((QVLAStorage<1UL,_1UL,_1232LL> *)buffer.super_QVLABase<unsigned_char>.super_QVLABaseBase.ptr
        != &buffer.super_QVLAStorage<1UL,_1UL,_1232LL>) {
      QtPrivate::sizedFree
                (buffer.super_QVLABase<unsigned_char>.super_QVLABaseBase.ptr,
                 buffer.super_QVLABase<unsigned_char>.super_QVLABaseBase.a);
    }
  }
  __res_nclose(&state);
LAB_00236d2a:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDnsLookupRunnable::query(QDnsLookupReply *reply)
{
    // Initialize state.
    std::remove_pointer_t<res_state> state = {};
    if (res_ninit(&state) < 0) {
        int error = errno;
        qErrnoWarning(error, "QDnsLookup: Resolver initialization failed");
        return reply->makeResolverSystemError(error);
    }
    auto guard = qScopeGuard([&] { res_nclose(&state); });

#ifdef QDNSLOOKUP_DEBUG
    state.options |= RES_DEBUG;
#endif

    // Prepare the DNS query.
    QueryBuffer qbuffer;
    int queryLength = prepareQueryBuffer(&state, qbuffer, requestName.constData(), ns_rcode(requestType));
    if (Q_UNLIKELY(queryLength < 0))
        return reply->makeResolverSystemError();

    // Perform DNS query.
    QSpan query(qbuffer.data(), queryLength);
    ReplyBuffer buffer(ReplyBufferSize);
    int responseLength = -1;
    switch (protocol) {
    case QDnsLookup::Standard:
        responseLength = sendStandardDns(reply, &state, query, buffer, nameserver, port);
        break;
    case QDnsLookup::DnsOverTls:
        if (!sendDnsOverTls(reply, query, buffer))
            return;
        responseLength = buffer.size();
        break;
    }

    if (responseLength < 0)
        return;

    // Check the reply is valid.
    if (responseLength < int(sizeof(HEADER)))
        return reply->makeInvalidReplyError();

    // Parse the reply.
    auto header = reinterpret_cast<HEADER *>(buffer.data());
    if (header->rcode)
        return reply->makeDnsRcodeError(header->rcode);

    qptrdiff offset = sizeof(HEADER);
    unsigned char *response = buffer.data();
    int status;

    auto expandHost = [&, cache = Cache{}](qptrdiff offset) mutable {
        if (uchar n = response[offset]; n & NS_CMPRSFLGS) {
            // compressed name, see if we already have it cached
            if (offset + 1 < responseLength) {
                int id = ((n & ~NS_CMPRSFLGS) << 8) | response[offset + 1];
                auto it = std::find_if(cache.constBegin(), cache.constEnd(),
                                  [id](const QDnsCachedName &n) { return n.code == id; });
                if (it != cache.constEnd()) {
                    status = 2;
                    return it->name;
                }
            }
        }

        // uncached, expand it
        char host[MAXCDNAME + 1];
        status = dn_expand(response, response + responseLength, response + offset,
                           host, sizeof(host));
        if (status >= 0)
            return cache.emplaceBack(decodeLabel(QLatin1StringView(host)), offset).name;

        // failed
        reply->makeInvalidReplyError(QDnsLookup::tr("Could not expand domain name"));
        return QString();
    };

    if (ntohs(header->qdcount) == 1) {
        // Skip the query host, type (2 bytes) and class (2 bytes).
        expandHost(offset);
        if (status < 0)
            return;
        if (offset + status + 4 > responseLength)
            header->qdcount = 0xffff;   // invalid reply below
        else
            offset += status + 4;
    }
    if (ntohs(header->qdcount) > 1)
        return reply->makeInvalidReplyError();

    // Extract results.
    const int answerCount = ntohs(header->ancount);
    int answerIndex = 0;
    while ((offset < responseLength) && (answerIndex < answerCount)) {
        const QString name = expandHost(offset);
        if (status < 0)
            return;

        offset += status;
        if (offset + RRFIXEDSZ > responseLength) {
            // probably just a truncated reply, return what we have
            return;
        }
        const quint16 type = qFromBigEndian<quint16>(response + offset);
        const qint16 rrclass = qFromBigEndian<quint16>(response + offset + 2);
        const quint32 ttl = qFromBigEndian<quint32>(response + offset + 4);
        const quint16 size = qFromBigEndian<quint16>(response + offset + 8);
        offset += RRFIXEDSZ;
        if (offset + size > responseLength)
            return;             // truncated
        if (rrclass != C_IN)
            continue;

        if (type == QDnsLookup::A) {
            if (size != 4)
                return reply->makeInvalidReplyError(QDnsLookup::tr("Invalid IPv4 address record"));
            const quint32 addr = qFromBigEndian<quint32>(response + offset);
            QDnsHostAddressRecord record;
            record.d->name = name;
            record.d->timeToLive = ttl;
            record.d->value = QHostAddress(addr);
            reply->hostAddressRecords.append(record);
        } else if (type == QDnsLookup::AAAA) {
            if (size != 16)
                return reply->makeInvalidReplyError(QDnsLookup::tr("Invalid IPv6 address record"));
            QDnsHostAddressRecord record;
            record.d->name = name;
            record.d->timeToLive = ttl;
            record.d->value = QHostAddress(response + offset);
            reply->hostAddressRecords.append(record);
        } else if (type == QDnsLookup::CNAME) {
            QDnsDomainNameRecord record;
            record.d->name = name;
            record.d->timeToLive = ttl;
            record.d->value = expandHost(offset);
            if (status < 0)
                return reply->makeInvalidReplyError(QDnsLookup::tr("Invalid canonical name record"));
            reply->canonicalNameRecords.append(record);
        } else if (type == QDnsLookup::NS) {
            QDnsDomainNameRecord record;
            record.d->name = name;
            record.d->timeToLive = ttl;
            record.d->value = expandHost(offset);
            if (status < 0)
                return reply->makeInvalidReplyError(QDnsLookup::tr("Invalid name server record"));
            reply->nameServerRecords.append(record);
        } else if (type == QDnsLookup::PTR) {
            QDnsDomainNameRecord record;
            record.d->name = name;
            record.d->timeToLive = ttl;
            record.d->value = expandHost(offset);
            if (status < 0)
                return reply->makeInvalidReplyError(QDnsLookup::tr("Invalid pointer record"));
            reply->pointerRecords.append(record);
        } else if (type == QDnsLookup::MX) {
            const quint16 preference = qFromBigEndian<quint16>(response + offset);
            QDnsMailExchangeRecord record;
            record.d->exchange = expandHost(offset + 2);
            record.d->name = name;
            record.d->preference = preference;
            record.d->timeToLive = ttl;
            if (status < 0)
                return reply->makeInvalidReplyError(QDnsLookup::tr("Invalid mail exchange record"));
            reply->mailExchangeRecords.append(record);
        } else if (type == QDnsLookup::SRV) {
            if (size < 7)
                return reply->makeInvalidReplyError(QDnsLookup::tr("Invalid service record"));
            const quint16 priority = qFromBigEndian<quint16>(response + offset);
            const quint16 weight = qFromBigEndian<quint16>(response + offset + 2);
            const quint16 port = qFromBigEndian<quint16>(response + offset + 4);
            QDnsServiceRecord record;
            record.d->name = name;
            record.d->target = expandHost(offset + 6);
            record.d->port = port;
            record.d->priority = priority;
            record.d->timeToLive = ttl;
            record.d->weight = weight;
            if (status < 0)
                return reply->makeInvalidReplyError(QDnsLookup::tr("Invalid service record"));
            reply->serviceRecords.append(record);
        } else if (type == QDnsLookup::TLSA) {
            // https://datatracker.ietf.org/doc/html/rfc6698#section-2.1
            if (size < 3)
                return reply->makeInvalidReplyError(QDnsLookup::tr("Invalid TLS association record"));

            const quint8 usage = response[offset];
            const quint8 selector = response[offset + 1];
            const quint8 matchType = response[offset + 2];

            QDnsTlsAssociationRecord record;
            record.d->name = name;
            record.d->timeToLive = ttl;
            record.d->usage = QDnsTlsAssociationRecord::CertificateUsage(usage);
            record.d->selector = QDnsTlsAssociationRecord::Selector(selector);
            record.d->matchType = QDnsTlsAssociationRecord::MatchingType(matchType);
            record.d->value.assign(response + offset + 3, response + offset + size);
            reply->tlsAssociationRecords.append(std::move(record));
        } else if (type == QDnsLookup::TXT) {
            QDnsTextRecord record;
            record.d->name = name;
            record.d->timeToLive = ttl;
            qptrdiff txt = offset;
            while (txt < offset + size) {
                const unsigned char length = response[txt];
                txt++;
                if (txt + length > offset + size)
                    return reply->makeInvalidReplyError(QDnsLookup::tr("Invalid text record"));
                record.d->values << QByteArrayView(response + txt, length).toByteArray();
                txt += length;
            }
            reply->textRecords.append(record);
        }
        offset += size;
        answerIndex++;
    }
}